

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::SerializeWithCachedSizesToArray
          (CodeGeneratorRequest *this,uint8 *target)

{
  uint value;
  char *data;
  undefined8 *puVar1;
  string *psVar2;
  FileDescriptorProto *this_00;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  LogMessage *pLVar4;
  long lVar5;
  uint32 uVar6;
  uint8 *puVar7;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (0 < (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_) {
    lVar5 = 0;
    do {
      data = *(this->file_to_generate_).super_RepeatedPtrFieldBase.elements_[lVar5];
      if ((this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar4 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_a1,pLVar4);
        internal::LogMessage::~LogMessage(&local_68);
      }
      internal::WireFormat::VerifyUTF8StringFallback
                (data,*(int *)((long)(this->file_to_generate_).super_RepeatedPtrFieldBase.elements_
                                     [lVar5] + 8),SERIALIZE);
      if ((this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar4 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_a1,pLVar4);
        internal::LogMessage::~LogMessage(&local_a0);
      }
      puVar1 = (undefined8 *)(this->file_to_generate_).super_RepeatedPtrFieldBase.elements_[lVar5];
      *target = '\n';
      uVar6 = (uint32)puVar1[1];
      if (uVar6 < 0x80) {
        target[1] = (uint8)puVar1[1];
        puVar7 = target + 2;
      }
      else {
        puVar7 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar6,target + 1);
      }
      target = io::CodedOutputStream::WriteRawToArray((void *)*puVar1,*(int *)(puVar1 + 1),puVar7);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((this->_has_bits_[0] & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->parameter_->_M_dataplus)._M_p,(int)this->parameter_->_M_string_length,
               SERIALIZE);
    psVar2 = this->parameter_;
    *target = '\x12';
    uVar6 = (uint32)psVar2->_M_string_length;
    if (uVar6 < 0x80) {
      target[1] = (uint8)psVar2->_M_string_length;
      puVar7 = target + 2;
    }
    else {
      puVar7 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar6,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,puVar7);
  }
  if (0 < (this->proto_file_).super_RepeatedPtrFieldBase.current_size_) {
    lVar5 = 0;
    do {
      this_00 = (FileDescriptorProto *)
                (this->proto_file_).super_RepeatedPtrFieldBase.elements_[lVar5];
      *target = 'z';
      value = this_00->_cached_size_;
      if (value < 0x80) {
        target[1] = (uint8)value;
        puVar7 = target + 2;
      }
      else {
        puVar7 = io::CodedOutputStream::WriteVarint32FallbackToArray(value,target + 1);
      }
      target = FileDescriptorProto::SerializeWithCachedSizesToArray(this_00,puVar7);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->proto_file_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    target = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* CodeGeneratorRequest::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // repeated string file_to_generate = 1;
  for (int i = 0; i < this->file_to_generate_size(); i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->file_to_generate(i).data(), this->file_to_generate(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(1, this->file_to_generate(i), target);
  }

  // optional string parameter = 2;
  if (has_parameter()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->parameter().data(), this->parameter().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->parameter(), target);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (int i = 0; i < this->proto_file_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        15, this->proto_file(i), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}